

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,FunctionType *type)

{
  uint uVar1;
  Type *type_00;
  uint local_24;
  Type *pTStack_20;
  uint i;
  FunctionType *local_18;
  FunctionType *type_local;
  StreamState *this_local;
  
  local_18 = type;
  type_local = (FunctionType *)this;
  pTStack_20 = FunctionType::getReturnType(type);
  append<char_const(&)[2],LLVMBC::Type*,char_const(&)[7]>
            (this,(char (*) [2])0x2a8f67,&stack0xffffffffffffffe0,(char (*) [7])" (*) (");
  local_24 = 0;
  while( true ) {
    uVar1 = FunctionType::getNumParams(local_18);
    if (uVar1 <= local_24) break;
    type_00 = FunctionType::getParamType(local_18,local_24);
    append(this,type_00);
    uVar1 = FunctionType::getNumParams(local_18);
    if (local_24 + 1 < uVar1) {
      append(this,", ");
    }
    local_24 = local_24 + 1;
  }
  append(this,"))");
  return;
}

Assistant:

void StreamState::append(FunctionType *type)
{
	append("(", type->getReturnType(), " (*) (");
	for (unsigned i = 0; i < type->getNumParams(); i++)
	{
		append(type->getParamType(i));
		if (i + 1 < type->getNumParams())
			append(", ");
	}
	append("))");
}